

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execAndiEa<(moira::Instr)10,(moira::Mode)2,(moira::Size)1>(Moira *this,u16 opcode)

{
  u16 uVar1;
  bool bVar2;
  u32 uVar3;
  uint val;
  u32 data;
  u32 ea;
  uint local_20;
  u32 local_1c;
  
  uVar1 = (this->queue).irc;
  readExt(this);
  bVar2 = readOp<(moira::Mode)2,(moira::Size)1,0ul>(this,opcode & 7,&local_1c,&local_20);
  if (bVar2) {
    val = (byte)uVar1 & local_20;
    (this->reg).sr.n = 0x7f < val;
    (this->reg).sr.z = val == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    uVar3 = (this->reg).pc;
    (this->reg).pc0 = uVar3;
    (this->queue).ird = (this->queue).irc;
    uVar3 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar3 + 2);
    (this->queue).irc = (u16)uVar3;
    writeM<(moira::MemSpace)1,(moira::Size)1,5ul>(this,local_1c,val);
  }
  return;
}

Assistant:

void
Moira::execAndiEa(u16 opcode)
{
    u32 ea, data, result;

    u32 src = readI<S>();
    int dst = _____________xxx(opcode);

    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;

    result = logic<I,S>(src, data);
    prefetch();

    writeOp <M,S, POLLIPL | REVERSE> (dst, ea, result);
}